

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTruth.c
# Opt level: O0

int If_CutComputeTruth(If_Man_t *p,If_Cut_t *pCut,If_Cut_t *pCut0,If_Cut_t *pCut1,int fCompl0,
                      int fCompl1)

{
  Vec_Mem_t *pVVar1;
  word *pOut;
  word *pOut_00;
  word *pOut_01;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  word *pIn;
  word *pIn_00;
  Vec_Int_t *p_00;
  Vec_Int_t *vLevel;
  word *pTruth;
  word *pTruth1;
  word *pTruth0;
  word *pTruth1s;
  word *pTruth0s;
  int RetValue;
  int PrevSize;
  int nLeavesNew;
  int truthId;
  int fCompl;
  int fCompl1_local;
  int fCompl0_local;
  If_Cut_t *pCut1_local;
  If_Cut_t *pCut0_local;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  pTruth0s._4_4_ = 0;
  pVVar1 = p->vTtMem[*(uint *)&pCut0->field_0x1c >> 0x18];
  iVar2 = Abc_Lit2Var(pCut0->iCutFunc);
  pIn = Vec_MemReadEntry(pVVar1,iVar2);
  pVVar1 = p->vTtMem[*(uint *)&pCut1->field_0x1c >> 0x18];
  iVar2 = Abc_Lit2Var(pCut1->iCutFunc);
  pIn_00 = Vec_MemReadEntry(pVVar1,iVar2);
  pOut = (word *)p->puTemp[0];
  pOut_00 = (word *)p->puTemp[1];
  pOut_01 = (word *)p->puTemp[2];
  iVar2 = p->nTruth6Words[*(uint *)&pCut0->field_0x1c >> 0x18];
  uVar4 = *(uint *)&pCut0->field_0x1c;
  uVar3 = Abc_LitIsCompl(pCut0->iCutFunc);
  Abc_TtCopy(pOut,pIn,iVar2,fCompl0 ^ uVar4 >> 0xc & 1 ^ uVar3);
  iVar2 = p->nTruth6Words[*(uint *)&pCut1->field_0x1c >> 0x18];
  uVar4 = *(uint *)&pCut1->field_0x1c;
  uVar3 = Abc_LitIsCompl(pCut1->iCutFunc);
  Abc_TtCopy(pOut_00,pIn_00,iVar2,fCompl1 ^ uVar4 >> 0xc & 1 ^ uVar3);
  Abc_TtStretch6(pOut,*(uint *)&pCut0->field_0x1c >> 0x18,*(uint *)&pCut->field_0x1c >> 0x18);
  Abc_TtStretch6(pOut_00,*(uint *)&pCut1->field_0x1c >> 0x18,*(uint *)&pCut->field_0x1c >> 0x18);
  Abc_TtExpand(pOut,*(uint *)&pCut->field_0x1c >> 0x18,(int *)(pCut0 + 1),
               *(uint *)&pCut0->field_0x1c >> 0x18,(int *)(pCut + 1),
               *(uint *)&pCut->field_0x1c >> 0x18);
  Abc_TtExpand(pOut_00,*(uint *)&pCut->field_0x1c >> 0x18,(int *)(pCut1 + 1),
               *(uint *)&pCut1->field_0x1c >> 0x18,(int *)(pCut + 1),
               *(uint *)&pCut->field_0x1c >> 0x18);
  uVar4 = (uint)*pOut & (uint)*pOut_00 & 1;
  Abc_TtAnd(pOut_01,pOut,pOut_00,p->nTruth6Words[*(uint *)&pCut->field_0x1c >> 0x18],uVar4);
  if ((p->pPars->fCutMin != 0) &&
     (((*(uint *)&pCut->field_0x1c >> 0x18 <
        (*(uint *)&pCut0->field_0x1c >> 0x18) + (*(uint *)&pCut1->field_0x1c >> 0x18) ||
       (*(uint *)&pCut0->field_0x1c >> 0x18 == 0)) || (*(uint *)&pCut1->field_0x1c >> 0x18 == 0))))
  {
    iVar2 = Abc_TtMinBase(pOut_01,(int *)(pCut + 1),*(uint *)&pCut->field_0x1c >> 0x18,
                          *(uint *)&pCut->field_0x1c >> 0x18);
    iVar5 = If_CutLeaveNum(pCut);
    if (iVar2 < iVar5) {
      *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xffffff | iVar2 << 0x18;
      uVar3 = If_ObjCutSignCompute(pCut);
      pCut->uSign = uVar3;
    }
    pTruth0s._4_4_ = (uint)(iVar2 < iVar5);
  }
  iVar2 = Vec_MemEntryNum(p->vTtMem[*(uint *)&pCut->field_0x1c >> 0x18]);
  iVar5 = Vec_MemHashInsert(p->vTtMem[*(uint *)&pCut->field_0x1c >> 0x18],pOut_01);
  iVar5 = Abc_Var2Lit(iVar5,uVar4);
  pCut->iCutFunc = iVar5;
  if ((*pOut_01 & 1) != 0) {
    __assert_fail("(pTruth[0] & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                  ,0x7f,
                  "int If_CutComputeTruth(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *, int, int)"
                 );
  }
  if ((p->vTtIsops[*(uint *)&pCut->field_0x1c >> 0x18] != (Vec_Wec_t *)0x0) &&
     (iVar5 = Vec_MemEntryNum(p->vTtMem[*(uint *)&pCut->field_0x1c >> 0x18]), iVar2 != iVar5)) {
    p_00 = Vec_WecPushLevel(p->vTtIsops[*(uint *)&pCut->field_0x1c >> 0x18]);
    iVar2 = Kit_TruthIsop((uint *)pOut_01,*(uint *)&pCut->field_0x1c >> 0x18,p->vCover,1);
    if (-1 < iVar2) {
      iVar5 = Vec_IntSize(p->vCover);
      Vec_IntGrow(p_00,iVar5);
      Vec_IntAppend(p_00,p->vCover);
      if (iVar2 != 0) {
        p_00->nCap = p_00->nCap ^ 0x10000;
      }
    }
    iVar2 = Vec_WecSize(p->vTtIsops[*(uint *)&pCut->field_0x1c >> 0x18]);
    iVar5 = Vec_MemEntryNum(p->vTtMem[*(uint *)&pCut->field_0x1c >> 0x18]);
    if (iVar2 != iVar5) {
      __assert_fail("Vec_WecSize(p->vTtIsops[pCut->nLeaves]) == Vec_MemEntryNum(p->vTtMem[pCut->nLeaves])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                    ,0x93,
                    "int If_CutComputeTruth(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *, int, int)"
                   );
    }
  }
  return pTruth0s._4_4_;
}

Assistant:

int If_CutComputeTruth( If_Man_t * p, If_Cut_t * pCut, If_Cut_t * pCut0, If_Cut_t * pCut1, int fCompl0, int fCompl1 )
{
    int fCompl, truthId, nLeavesNew, PrevSize, RetValue = 0;
    word * pTruth0s = Vec_MemReadEntry( p->vTtMem[pCut0->nLeaves], Abc_Lit2Var(pCut0->iCutFunc) );
    word * pTruth1s = Vec_MemReadEntry( p->vTtMem[pCut1->nLeaves], Abc_Lit2Var(pCut1->iCutFunc) );
    word * pTruth0  = (word *)p->puTemp[0];
    word * pTruth1  = (word *)p->puTemp[1];
    word * pTruth   = (word *)p->puTemp[2];
    Abc_TtCopy( pTruth0, pTruth0s, p->nTruth6Words[pCut0->nLeaves], fCompl0 ^ pCut0->fCompl ^ Abc_LitIsCompl(pCut0->iCutFunc) );
    Abc_TtCopy( pTruth1, pTruth1s, p->nTruth6Words[pCut1->nLeaves], fCompl1 ^ pCut1->fCompl ^ Abc_LitIsCompl(pCut1->iCutFunc) );
    Abc_TtStretch6( pTruth0, pCut0->nLeaves, pCut->nLeaves );
    Abc_TtStretch6( pTruth1, pCut1->nLeaves, pCut->nLeaves );
    Abc_TtExpand( pTruth0, pCut->nLeaves, pCut0->pLeaves, pCut0->nLeaves, pCut->pLeaves, pCut->nLeaves );
    Abc_TtExpand( pTruth1, pCut->nLeaves, pCut1->pLeaves, pCut1->nLeaves, pCut->pLeaves, pCut->nLeaves );
    fCompl         = (pTruth0[0] & pTruth1[0] & 1);
    Abc_TtAnd( pTruth, pTruth0, pTruth1, p->nTruth6Words[pCut->nLeaves], fCompl );
    if ( p->pPars->fCutMin && (pCut0->nLeaves + pCut1->nLeaves > pCut->nLeaves || pCut0->nLeaves == 0 || pCut1->nLeaves == 0) )
    {
        nLeavesNew = Abc_TtMinBase( pTruth, pCut->pLeaves, pCut->nLeaves, pCut->nLeaves );
        if ( nLeavesNew < If_CutLeaveNum(pCut) )
        {
            pCut->nLeaves = nLeavesNew;
            pCut->uSign   = If_ObjCutSignCompute( pCut );
            RetValue      = 1;
        }
    }
    PrevSize       = Vec_MemEntryNum( p->vTtMem[pCut->nLeaves] );   
    truthId        = Vec_MemHashInsert( p->vTtMem[pCut->nLeaves], pTruth );
    pCut->iCutFunc = Abc_Var2Lit( truthId, fCompl );
    assert( (pTruth[0] & 1) == 0 );
#ifdef IF_TRY_NEW
    {
        word pCopy[1024];
        char pCanonPerm[16];
        memcpy( pCopy, If_CutTruthW(pCut), sizeof(word) * p->nTruth6Words[pCut->nLeaves] );
        Abc_TtCanonicize( pCopy, pCut->nLeaves, pCanonPerm );
    }
#endif
    if ( p->vTtIsops[pCut->nLeaves] && PrevSize != Vec_MemEntryNum(p->vTtMem[pCut->nLeaves]) )
    {
        Vec_Int_t * vLevel = Vec_WecPushLevel( p->vTtIsops[pCut->nLeaves] );
        fCompl = Kit_TruthIsop( (unsigned *)pTruth, pCut->nLeaves, p->vCover, 1 );
        if ( fCompl >= 0 )
        {
            Vec_IntGrow( vLevel, Vec_IntSize(p->vCover) );
            Vec_IntAppend( vLevel, p->vCover );
            if ( fCompl )
                vLevel->nCap ^= (1<<16); // hack to remember complemented attribute
        }
        assert( Vec_WecSize(p->vTtIsops[pCut->nLeaves]) == Vec_MemEntryNum(p->vTtMem[pCut->nLeaves]) );
    }
    return RetValue;
}